

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_image_resize_nn_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,int new_width,int new_height,void *dst,
          rf_int dst_size)

{
  long lVar1;
  rf_source_location source_location;
  int iVar2;
  uint uVar3;
  long *in_FS_OFFSET;
  undefined4 uStack_a4;
  undefined4 uStack_6c;
  long local_50;
  rf_int x;
  rf_int y;
  int y2;
  int x2;
  uchar *src;
  int y_ratio;
  int x_ratio;
  int expected_size;
  int bpp;
  rf_int dst_size_local;
  void *dst_local;
  int new_height_local;
  int new_width_local;
  
  memset(__return_storage_ptr__,0,0x18);
  if (((undefined1  [24])image & (undefined1  [24])0x100000000) == (undefined1  [24])0x0) {
    rf_log_impl(8,0x1b291e,(char *)0x1);
    lVar1 = *in_FS_OFFSET;
    *(char **)(lVar1 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar1 + -0x458) = "rf_image_resize_nn_to_buffer";
    *(undefined8 *)(lVar1 + -0x450) = 0x3e64;
    *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_a4,1);
  }
  else {
    iVar2 = rf_bytes_per_pixel(image.format);
    uVar3 = new_width * new_height * iVar2;
    if (dst_size < (int)uVar3) {
      source_location.proc_name = "rf_image_resize_nn_to_buffer";
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.line_in_file = 0x3e62;
      rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                  "Expected `dst` to be at least %d bytes but was %d bytes",4,(ulong)uVar3,dst_size,
                  "rf_image_resize_nn_to_buffer");
      lVar1 = *in_FS_OFFSET;
      *(char **)(lVar1 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar1 + -0x458) = "rf_image_resize_nn_to_buffer";
      *(undefined8 *)(lVar1 + -0x450) = 0x3e62;
      *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_6c,4);
    }
    else {
      for (x = 0; x < new_height; x = x + 1) {
        for (local_50 = 0; local_50 < new_width; local_50 = local_50 + 1) {
          rf_format_one_pixel((void *)((long)image.data +
                                      (long)(((int)((ulong)(x * ((image.height << 0x10) / new_height
                                                                + 1)) >> 0x10) * image.width +
                                             (int)((ulong)(local_50 *
                                                          ((image.width << 0x10) / new_width + 1))
                                                  >> 0x10)) * iVar2)),image.format,
                              (void *)((long)dst + (x * new_width + local_50) * (long)iVar2),
                              image.format);
        }
      }
      __return_storage_ptr__->data = dst;
      __return_storage_ptr__->width = new_width;
      __return_storage_ptr__->height = new_height;
      __return_storage_ptr__->format = image.format;
      __return_storage_ptr__->valid = true;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_resize_nn_to_buffer(rf_image image, int new_width, int new_height, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        int bpp = rf_bytes_per_pixel(image.format);
        int expected_size = new_width * new_height * bpp;

        if (dst_size >= expected_size)
        {
            // EDIT: added +1 to account for an early rounding problem
            int x_ratio = (int)((image.width  << 16) / new_width ) + 1;
            int y_ratio = (int)((image.height << 16) / new_height) + 1;

            unsigned char* src = image.data;

            int x2, y2;
            for (rf_int y = 0; y < new_height; y++)
            {
                for (rf_int x = 0; x < new_width; x++)
                {
                    x2 = ((x * x_ratio) >> 16);
                    y2 = ((y * y_ratio) >> 16);

                    rf_format_one_pixel(src + ((y2 * image.width) + x2) * bpp, image.format,
                                        ((unsigned char *) dst) + ((y * new_width) + x) * bpp, image.format);
                }
            }

            result.data   = dst;
            result.width  = new_width;
            result.height = new_height;
            result.format = image.format;
            result.valid  = true;
        }
        else RF_LOG_ERROR(RF_BAD_BUFFER_SIZE, "Expected `dst` to be at least %d bytes but was %d bytes", expected_size, dst_size);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image is invalid.");

    return result;
}